

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ScaleLayerParams::ScaleLayerParams
          (ScaleLayerParams *this,ScaleLayerParams *from)

{
  int iVar1;
  void *pvVar2;
  WeightParams *pWVar3;
  WeightParams *pWVar4;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ScaleLayerParams_00700ff0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->shapescale_).current_size_ = 0;
  (this->shapescale_).total_size_ = 0;
  (this->shapescale_).rep_ = (Rep *)0x0;
  iVar1 = (from->shapescale_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->shapescale_,iVar1);
    memcpy(((this->shapescale_).rep_)->elements,((from->shapescale_).rep_)->elements,
           (long)(from->shapescale_).current_size_ << 3);
    (this->shapescale_).current_size_ = (from->shapescale_).current_size_;
  }
  (this->shapebias_).current_size_ = 0;
  (this->shapebias_).total_size_ = 0;
  (this->shapebias_).rep_ = (Rep *)0x0;
  iVar1 = (from->shapebias_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve(&this->shapebias_,iVar1);
    memcpy(((this->shapebias_).rep_)->elements,((from->shapebias_).rep_)->elements,
           (long)(from->shapebias_).current_size_ << 3);
    (this->shapebias_).current_size_ = (from->shapebias_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  pWVar3 = from->scale_;
  if (pWVar3 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar3);
  }
  this->scale_ = pWVar4;
  pWVar3 = from->bias_;
  if (pWVar3 == (WeightParams *)0x0 ||
      from == (ScaleLayerParams *)&_ScaleLayerParams_default_instance_) {
    pWVar4 = (WeightParams *)0x0;
  }
  else {
    pWVar4 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar4,pWVar3);
  }
  this->bias_ = pWVar4;
  this->hasbias_ = from->hasbias_;
  return;
}

Assistant:

ScaleLayerParams::ScaleLayerParams(const ScaleLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      shapescale_(from.shapescale_),
      shapebias_(from.shapebias_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_scale()) {
    scale_ = new ::CoreML::Specification::WeightParams(*from.scale_);
  } else {
    scale_ = NULL;
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::WeightParams(*from.bias_);
  } else {
    bias_ = NULL;
  }
  hasbias_ = from.hasbias_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ScaleLayerParams)
}